

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTessellation.cpp
# Opt level: O3

void __thiscall
glcts::TessellationShaderTessellationgl_TessCoord::initTest
          (TessellationShaderTessellationgl_TessCoord *this)

{
  pointer *pp_Var1;
  ulong uVar2;
  iterator __position;
  bool bVar3;
  uint uVar4;
  int iVar5;
  deUint32 dVar6;
  GLuint GVar7;
  undefined4 extraout_var;
  TestError *this_00;
  NotSupportedError *pNVar9;
  _tessellation_primitive_mode primitive_mode;
  pointer inner_tess_level;
  bool bVar10;
  ulong uVar11;
  GLint gl_max_tess_gen_level_value;
  GLint compile_status;
  size_type sStack_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  GLfloat GStack_88;
  GLfloat GStack_84;
  GLfloat GStack_80;
  _tessellation_test_type _Stack_7c;
  _tessellation_shader_vertex_spacing _Stack_78;
  undefined8 uStack_74;
  _tessellation_levels_set tessellation_levels;
  char *vs_body;
  char *fs_body;
  long lVar8;
  
  if ((this->super_TestCaseBase).m_is_tessellation_shader_supported == false) {
    pNVar9 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    _compile_status = (pointer)&local_98;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&compile_status,"Tessellation shader functionality not supported, skipping"
               ,"");
    tcu::NotSupportedError::NotSupportedError(pNVar9,(string *)&compile_status);
    __cxa_throw(pNVar9,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  uVar4 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  if (((uVar4 & 0x300) == 0) && (this->m_test_type == TESSELLATION_TEST_TYPE_TES)) {
    pNVar9 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    _compile_status = (pointer)&local_98;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&compile_status,"Test can\'t be run in ES context","");
    tcu::NotSupportedError::NotSupportedError(pNVar9,(string *)&compile_status);
    __cxa_throw(pNVar9,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  iVar5 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar5);
  (**(code **)(lVar8 + 0x708))(1,&this->m_vao_id);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"Could not generate vertex array object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x6db);
  (**(code **)(lVar8 + 0xd8))(this->m_vao_id);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"Error binding vertex array object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x6de);
  (**(code **)(lVar8 + 0x6c8))(1);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"glGenBuffers() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x6e1);
  GVar7 = (**(code **)(lVar8 + 0x3f0))
                    ((this->super_TestCaseBase).m_glExtTokens.TESS_EVALUATION_SHADER);
  this->m_broken_ts_id = GVar7;
  GVar7 = (**(code **)(lVar8 + 0x3f0))(0x8b30);
  this->m_fs_id = GVar7;
  GVar7 = (**(code **)(lVar8 + 0x3f0))(0x8b31);
  this->m_vs_id = GVar7;
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"glCreateShader() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x6e6);
  fs_body = "${VERSION}\n\nvoid main()\n{\n}\n";
  TestCaseBase::shaderSourceSpecialized(&this->super_TestCaseBase,this->m_fs_id,1,&fs_body);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"glShaderSource() failed for fragment shader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x6f0);
  vs_body = "${VERSION}\n\nvoid main()\n{\n    gl_Position = vec4(1.0, 0.0, 0.0, 1.0);\n}\n";
  TestCaseBase::shaderSourceSpecialized(&this->super_TestCaseBase,this->m_vs_id,1,&vs_body);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"glShaderSource() failed for vertex shader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x6fb);
  uVar2._0_4_ = this->m_fs_id;
  uVar2._4_4_ = this->m_vs_id;
  uVar11 = uVar2;
  bVar3 = true;
  do {
    bVar10 = bVar3;
    if ((int)uVar11 != 0) {
      _compile_status = _compile_status & 0xffffffff00000000;
      (**(code **)(lVar8 + 0x248))(uVar11 & 0xffffffff);
      dVar6 = (**(code **)(lVar8 + 0x800))();
      glu::checkError(dVar6,"glCompileShader() failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                      ,0x70a);
      (**(code **)(lVar8 + 0xa70))(uVar11 & 0xffffffff,0x8b81,&compile_status);
      dVar6 = (**(code **)(lVar8 + 0x800))();
      glu::checkError(dVar6,"glGetShaderiv() failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                      ,0x70d);
      if (compile_status != 1) {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"Shader compilation failed",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                   ,0x711);
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
    }
    primitive_mode = TESSELLATION_SHADER_PRIMITIVE_MODE_FIRST;
    uVar11 = uVar2 >> 0x20;
    bVar3 = false;
  } while (bVar10);
  (**(code **)(lVar8 + 0x868))((this->super_TestCaseBase).m_glExtTokens.MAX_TESS_GEN_LEVEL);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"glGetIntegerv() failed for GL_MAX_TESS_GEN_LEVEL_EXT pname",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x71a);
  do {
    TessellationShaderUtils::getTessellationLevelSetForPrimitiveMode
              (&tessellation_levels,primitive_mode,0,
               TESSELLATION_LEVEL_SET_FILTER_ALL_LEVELS_USE_THE_SAME_VALUE);
    inner_tess_level =
         tessellation_levels.
         super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
         ._M_impl.super__Vector_impl_data._M_start;
    if (tessellation_levels.
        super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        tessellation_levels.
        super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        local_98._M_allocated_capacity._4_4_ = 0.0;
        local_98._8_4_ = 0.0;
        local_98._12_4_ = 0.0;
        GStack_88 = 0.0;
        GStack_84 = 0.0;
        GStack_80 = 0.0;
        _compile_status = (pointer)0x0;
        sStack_a0 = 3;
        local_98._M_allocated_capacity._0_4_ = 0;
        _Stack_7c = TESSELLATION_TEST_TYPE_COUNT;
        _Stack_78 = TESSELLATION_SHADER_VERTEX_SPACING_COUNT;
        uStack_74._0_4_ = -1;
        uStack_74._4_4_ = -1;
        initTestDescriptor(this,(_test_descriptor *)&compile_status,
                           TESSELLATION_SHADER_VERTEX_SPACING_EQUAL,primitive_mode,1,
                           inner_tess_level->inner,inner_tess_level->outer,this->m_test_type);
        __position._M_current =
             (this->m_tests).
             super__Vector_base<glcts::TessellationShaderTessellationgl_TessCoord::_test_descriptor,_std::allocator<glcts::TessellationShaderTessellationgl_TessCoord::_test_descriptor>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->m_tests).
            super__Vector_base<glcts::TessellationShaderTessellationgl_TessCoord::_test_descriptor,_std::allocator<glcts::TessellationShaderTessellationgl_TessCoord::_test_descriptor>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<glcts::TessellationShaderTessellationgl_TessCoord::_test_descriptor,std::allocator<glcts::TessellationShaderTessellationgl_TessCoord::_test_descriptor>>
          ::
          _M_realloc_insert<glcts::TessellationShaderTessellationgl_TessCoord::_test_descriptor_const&>
                    ((vector<glcts::TessellationShaderTessellationgl_TessCoord::_test_descriptor,std::allocator<glcts::TessellationShaderTessellationgl_TessCoord::_test_descriptor>>
                      *)&this->m_tests,__position,(_test_descriptor *)&compile_status);
        }
        else {
          (__position._M_current)->type = _Stack_7c;
          (__position._M_current)->vertex_spacing = _Stack_78;
          (__position._M_current)->inner_tess_level_uniform_location = (GLint)uStack_74;
          (__position._M_current)->outer_tess_level_uniform_location = uStack_74._4_4_;
          *(ulong *)((__position._M_current)->tess_level_outer + 1) = CONCAT44(GStack_84,GStack_88);
          *(ulong *)((__position._M_current)->tess_level_outer + 3) = CONCAT44(_Stack_7c,GStack_80);
          (__position._M_current)->te_id = local_98._0_4_;
          (__position._M_current)->tess_level_inner[0] = (GLfloat)local_98._4_4_;
          *(undefined8 *)((__position._M_current)->tess_level_inner + 1) = local_98._8_8_;
          *(pointer *)__position._M_current = _compile_status;
          (__position._M_current)->primitive_mode = (undefined4)sStack_a0;
          (__position._M_current)->tc_id = sStack_a0._4_4_;
          pp_Var1 = &(this->m_tests).
                     super__Vector_base<glcts::TessellationShaderTessellationgl_TessCoord::_test_descriptor,_std::allocator<glcts::TessellationShaderTessellationgl_TessCoord::_test_descriptor>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *pp_Var1 = *pp_Var1 + 1;
        }
        inner_tess_level = inner_tess_level + 1;
      } while (inner_tess_level !=
               tessellation_levels.
               super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    if (tessellation_levels.
        super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(tessellation_levels.
                      super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)tessellation_levels.
                            super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)tessellation_levels.
                            super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    primitive_mode = primitive_mode + TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES;
  } while (primitive_mode != TESSELLATION_SHADER_PRIMITIVE_MODE_COUNT);
  (**(code **)(lVar8 + 0x40))(0x8c8e,this->m_bo_id);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"glBindBuffer() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x738);
  (**(code **)(lVar8 + 0x48))(0x8c8e,0,this->m_bo_id);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"glBindBufferBase() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x73b);
  return;
}

Assistant:

void TessellationShaderTessellationgl_TessCoord::initTest()
{
	/* Skip if required extensions are not supported. */
	if (!m_is_tessellation_shader_supported)
	{
		throw tcu::NotSupportedError(TESSELLATION_SHADER_EXTENSION_NOT_SUPPORTED);
	}

	if (glu::isContextTypeES(m_context.getRenderContext().getType()) && m_test_type == TESSELLATION_TEST_TYPE_TES)
	{
		throw tcu::NotSupportedError("Test can't be run in ES context");
	}

	/* Generate all test-wide objects needed for test execution */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not generate vertex array object");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding vertex array object!");

	gl.genBuffers(1, &m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() failed");

	m_broken_ts_id = gl.createShader(m_glExtTokens.TESS_EVALUATION_SHADER);
	m_fs_id		   = gl.createShader(GL_FRAGMENT_SHADER);
	m_vs_id		   = gl.createShader(GL_VERTEX_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() failed");

	/* Configure fragment shader body */
	const char* fs_body = "${VERSION}\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "}\n";

	shaderSourceSpecialized(m_fs_id, 1 /* count */, &fs_body);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() failed for fragment shader");

	/* Configure vertex shader body */
	const char* vs_body = "${VERSION}\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    gl_Position = vec4(1.0, 0.0, 0.0, 1.0);\n"
						  "}\n";

	shaderSourceSpecialized(m_vs_id, 1 /* count */, &vs_body);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() failed for vertex shader");

	/* Compile all the shaders */
	const glw::GLuint  shaders[] = { m_fs_id, m_vs_id };
	const unsigned int n_shaders = sizeof(shaders) / sizeof(shaders[0]);

	for (unsigned int n_shader = 0; n_shader < n_shaders; ++n_shader)
	{
		glw::GLuint shader = shaders[n_shader];

		if (shader != 0)
		{
			glw::GLint compile_status = GL_FALSE;

			gl.compileShader(shader);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() failed");

			gl.getShaderiv(shader, GL_COMPILE_STATUS, &compile_status);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() failed");

			if (compile_status != GL_TRUE)
			{
				TCU_FAIL("Shader compilation failed");
			}
		}
	} /* for (all shaders) */

	/* Retrieve GL_MAX_TESS_GEN_LEVEL_EXT value before we start looping */
	glw::GLint gl_max_tess_gen_level_value = 0;

	gl.getIntegerv(m_glExtTokens.MAX_TESS_GEN_LEVEL, &gl_max_tess_gen_level_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_TESS_GEN_LEVEL_EXT pname");

	/* Initialize all test passes - iterate over all primitive modes supported.. */
	for (int primitive_mode = static_cast<int>(TESSELLATION_SHADER_PRIMITIVE_MODE_FIRST);
		 primitive_mode != static_cast<int>(TESSELLATION_SHADER_PRIMITIVE_MODE_COUNT); primitive_mode++)
	{
		/* Iterate over all tessellation level combinations defined for current primitive mode */
		_tessellation_levels_set tessellation_levels = TessellationShaderUtils::getTessellationLevelSetForPrimitiveMode(
			static_cast<_tessellation_primitive_mode>(primitive_mode), gl_max_tess_gen_level_value,
			TESSELLATION_LEVEL_SET_FILTER_ALL_LEVELS_USE_THE_SAME_VALUE);

		for (_tessellation_levels_set_const_iterator levels_iterator = tessellation_levels.begin();
			 levels_iterator != tessellation_levels.end(); levels_iterator++)
		{
			const _tessellation_levels& levels = *levels_iterator;
			_test_descriptor			test;

			initTestDescriptor(test, TESSELLATION_SHADER_VERTEX_SPACING_EQUAL,
							   static_cast<_tessellation_primitive_mode>(primitive_mode), 1, /* n_patch_vertices */
							   levels.inner, levels.outer, m_test_type);

			/* Store the test descriptor */
			m_tests.push_back(test);
		} /* for (all tessellation level combinations for current primitive mode) */
	}	 /* for (all primitive modes) */

	/* Set up buffer object bindings. Storage size will be determined on
	 * a per-iteration basis.
	 **/
	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() failed");

	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* index */, m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase() failed");
}